

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_qmfb.c
# Opt level: O3

int jpc_ft_synthesize(jpc_fix_t *a,int xstart,int ystart,int width,int height,int stride)

{
  jpc_fix_t *pjVar1;
  ulong *puVar2;
  jpc_fix_t *pjVar3;
  jpc_fix_t *pjVar4;
  ulong *puVar5;
  uint uVar6;
  jpc_fix_t *pjVar7;
  int iVar8;
  jpc_fix_t *pjVar9;
  long lVar10;
  ulong *puVar11;
  jpc_fix_t *pjVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  jpc_fix_t *pjVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  jpc_fix_t *pjVar21;
  ulong *a_00;
  int iVar23;
  undefined1 auVar22 [16];
  uint local_58;
  
  if (height != 0) {
    uVar13 = xstart & 1;
    uVar17 = (uVar13 ^ 1) + width >> 1;
    uVar19 = width & 1;
    uVar6 = (uint)(uVar19 == uVar13);
    uVar20 = (uint)(uVar19 != uVar13);
    pjVar4 = a + uVar17;
    iVar8 = 0;
    a_00 = (ulong *)a;
    do {
      if ((uint)width < 2) {
        if (uVar13 != 0) {
          *a_00 = (long)(int)(*a_00 >> 1);
        }
      }
      else {
        puVar2 = a_00 + uVar17;
        puVar5 = a_00;
        if (uVar13 == 0) {
          *a_00 = *a_00 - ((long)(*puVar2 * 0x80000000 + 0x80000000) >> 0x20);
          puVar5 = a_00 + 1;
        }
        puVar11 = puVar2;
        if (uVar17 - (uVar13 == 0) != uVar20) {
          lVar18 = 0;
          lVar10 = 0;
          do {
            puVar5[lVar10] =
                 puVar5[lVar10] -
                 ((pjVar4[lVar10 + 1] + pjVar4[lVar10]) * 0x40000000 + 0x80000000 >> 0x20);
            lVar10 = lVar10 + 1;
            lVar18 = lVar18 + -8;
          } while ((uVar20 - uVar17) + (uint)(uVar13 == 0) + (int)lVar10 != 0);
          puVar5 = (ulong *)((long)puVar5 - lVar18);
          puVar11 = (ulong *)((long)pjVar4 - lVar18);
        }
        if (uVar19 != uVar13) {
          *puVar5 = *puVar5 - ((long)(*puVar11 * 0x80000000 + 0x80000000) >> 0x20);
        }
        if (uVar13 != 0) {
          *puVar2 = *puVar2 + *a_00;
          puVar2 = puVar2 + 1;
        }
        puVar5 = a_00;
        if ((width - uVar13) - uVar17 != uVar6) {
          lVar10 = 0;
          lVar18 = 0;
          do {
            puVar2[lVar18] = puVar2[lVar18] + (long)(int)(a_00[lVar18 + 1] + a_00[lVar18] >> 1);
            lVar18 = lVar18 + 1;
            lVar10 = lVar10 + -8;
          } while (((width - uVar6) - uVar17) - uVar13 != (int)lVar18);
          puVar2 = (ulong *)((long)puVar2 - lVar10);
          puVar5 = (ulong *)((long)a_00 - lVar10);
        }
        if (uVar19 == uVar13) {
          *puVar2 = *puVar2 + *puVar5;
        }
      }
      jpc_qmfb_join_row((jpc_fix_t *)a_00,width,uVar13);
      a_00 = a_00 + stride;
      iVar8 = iVar8 + 1;
      pjVar4 = pjVar4 + stride;
    } while (iVar8 != height);
  }
  uVar6 = ystart & 1;
  local_58 = width & 0xfffffff0;
  if ((width & 0xfffffff0U) != 0) {
    uVar13 = (height - uVar6) + 1 >> 1;
    uVar15 = (ulong)(uVar13 * stride);
    uVar17 = height & 1;
    iVar8 = (height - (uVar13 + uVar6)) - (uint)(uVar17 == uVar6);
    pjVar16 = a + (uint)stride + uVar15;
    pjVar4 = a + uVar15;
    pjVar9 = a + (uint)stride;
    uVar19 = 0;
    do {
      if ((uint)height < 2) {
        if (uVar6 != 0) {
          lVar10 = 0;
          do {
            iVar14 = (int)((ulong)((a + lVar10)[1] << 0x1f) >> 0x20);
            pjVar21 = a + lVar10;
            *pjVar21 = (long)(int)((ulong)(a[lVar10] << 0x1f) >> 0x20);
            *(int *)(pjVar21 + 2) = iVar14;
            *(int *)((long)pjVar21 + 0x14) = iVar14 >> 0x1f;
            lVar10 = lVar10 + 2;
          } while (lVar10 != 0x10);
        }
      }
      else {
        pjVar21 = a;
        if (uVar6 == 0) {
          lVar10 = 0;
          do {
            iVar14 = (int)((ulong)(a[uVar15 + lVar10] * 0x80000000 + 0x80000000) >> 0x20);
            iVar23 = (int)((ulong)((a + uVar15 + lVar10)[1] * 0x80000000 + 0x80000000) >> 0x20);
            auVar22._4_4_ = iVar23;
            auVar22._0_4_ = iVar14;
            auVar22._8_4_ = iVar23;
            auVar22._12_4_ = iVar23 >> 0x1f;
            lVar18 = (a + lVar10)[1];
            a[lVar10] = a[lVar10] - (long)iVar14;
            (a + lVar10)[1] = lVar18 - auVar22._8_8_;
            lVar10 = lVar10 + 2;
          } while (lVar10 != 0x10);
          pjVar21 = a + (uint)stride;
        }
        pjVar3 = a + uVar15;
        pjVar7 = pjVar3;
        pjVar12 = pjVar16;
        pjVar1 = pjVar4;
        for (iVar14 = (uVar13 - (uVar6 == 0)) - (uint)(uVar17 != uVar6); iVar14 != 0;
            iVar14 = iVar14 + -1) {
          lVar10 = 0;
          do {
            pjVar21[lVar10] =
                 pjVar21[lVar10] -
                 ((pjVar12[lVar10] + pjVar1[lVar10]) * 0x40000000 + 0x80000000 >> 0x20);
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x10);
          pjVar21 = pjVar21 + (uint)stride;
          pjVar7 = pjVar1 + (uint)stride;
          pjVar12 = pjVar12 + (uint)stride;
          pjVar1 = pjVar7;
        }
        if (uVar17 != uVar6) {
          lVar10 = 0;
          do {
            pjVar21[lVar10] = pjVar21[lVar10] - (pjVar7[lVar10] * 0x80000000 + 0x80000000 >> 0x20);
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x10);
        }
        iVar14 = iVar8;
        pjVar21 = a;
        pjVar7 = pjVar9;
        if (uVar6 != 0) {
          lVar10 = 0;
          do {
            pjVar4[lVar10] = pjVar4[lVar10] + a[lVar10];
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x10);
          pjVar3 = pjVar3 + (uint)stride;
        }
        for (; iVar14 != 0; iVar14 = iVar14 + -1) {
          lVar10 = 0;
          do {
            pjVar3[lVar10] =
                 pjVar3[lVar10] + (long)(int)((ulong)(pjVar7[lVar10] + pjVar21[lVar10]) >> 1);
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x10);
          pjVar3 = pjVar3 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
          pjVar7 = pjVar7 + (uint)stride;
        }
        if (uVar17 == uVar6) {
          lVar10 = 0;
          do {
            pjVar3[lVar10] = pjVar3[lVar10] + pjVar21[lVar10];
            lVar10 = lVar10 + 1;
          } while ((int)lVar10 != 0x10);
        }
      }
      jpc_qmfb_join_colgrp(a,height,stride,uVar6);
      a = a + 0x10;
      uVar19 = uVar19 + 0x10;
      pjVar16 = pjVar16 + 0x10;
      pjVar4 = pjVar4 + 0x10;
      pjVar9 = pjVar9 + 0x10;
    } while (uVar19 < local_58);
  }
  if (local_58 != width) {
    uVar13 = width & 0xf;
    if ((uint)height < 2) {
      if ((width & 0xfU) != 0 && uVar6 != 0) {
        lVar10 = 0;
        do {
          a[lVar10] = (long)(int)((ulong)a[lVar10] >> 1);
          lVar10 = lVar10 + 1;
        } while (uVar13 != (uint)lVar10);
      }
    }
    else {
      uVar17 = (uVar6 ^ 1) + height >> 1;
      pjVar4 = a + uVar17 * stride;
      pjVar9 = a;
      if (uVar6 == 0) {
        if ((width & 0xfU) != 0) {
          lVar10 = 0;
          do {
            a[lVar10] = a[lVar10] - (pjVar4[lVar10] * 0x80000000 + 0x80000000 >> 0x20);
            lVar10 = lVar10 + 1;
          } while (uVar13 != (uint)lVar10);
        }
        pjVar9 = a + (uint)stride;
      }
      uVar19 = height & 1;
      iVar8 = (uVar17 - (uVar6 == 0)) - (uint)(uVar19 != uVar6);
      pjVar16 = pjVar4;
      if (iVar8 != 0) {
        pjVar21 = a + (ulong)(uint)stride + (ulong)(uVar17 * stride);
        do {
          if ((width & 0xfU) != 0) {
            lVar10 = 0;
            do {
              pjVar9[lVar10] =
                   pjVar9[lVar10] -
                   ((pjVar21[lVar10] + pjVar16[lVar10]) * 0x40000000 + 0x80000000 >> 0x20);
              lVar10 = lVar10 + 1;
            } while (uVar13 != (uint)lVar10);
          }
          pjVar9 = pjVar9 + (uint)stride;
          pjVar16 = pjVar16 + (uint)stride;
          pjVar21 = pjVar21 + (uint)stride;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      if ((width & 0xfU) != 0 && uVar19 != uVar6) {
        lVar10 = 0;
        do {
          pjVar9[lVar10] = pjVar9[lVar10] - (pjVar16[lVar10] * 0x80000000 + 0x80000000 >> 0x20);
          lVar10 = lVar10 + 1;
        } while (uVar13 != (uint)lVar10);
      }
      if (uVar6 != 0) {
        if ((width & 0xfU) != 0) {
          lVar10 = 0;
          do {
            pjVar4[lVar10] = pjVar4[lVar10] + a[lVar10];
            lVar10 = lVar10 + 1;
          } while (uVar13 != (uint)lVar10);
        }
        pjVar4 = pjVar4 + (uint)stride;
      }
      iVar8 = (height - (uVar17 + uVar6)) - (uint)(uVar19 == uVar6);
      pjVar9 = a;
      if (iVar8 != 0) {
        pjVar16 = a;
        do {
          pjVar16 = pjVar16 + (uint)stride;
          if ((width & 0xfU) != 0) {
            lVar10 = 0;
            do {
              pjVar4[lVar10] =
                   pjVar4[lVar10] + (long)(int)((ulong)(pjVar16[lVar10] + pjVar9[lVar10]) >> 1);
              lVar10 = lVar10 + 1;
            } while (uVar13 != (uint)lVar10);
          }
          pjVar4 = pjVar4 + (uint)stride;
          pjVar9 = pjVar9 + (uint)stride;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      if ((width & 0xfU) != 0 && uVar19 == uVar6) {
        lVar10 = 0;
        do {
          pjVar4[lVar10] = pjVar4[lVar10] + pjVar9[lVar10];
          lVar10 = lVar10 + 1;
        } while (uVar13 != (uint)lVar10);
      }
    }
    jpc_qmfb_join_colres(a,height,uVar13,stride,uVar6);
  }
  return 0;
}

Assistant:

int jpc_ft_synthesize(jpc_fix_t *a, int xstart, int ystart, int width, int height,
  int stride)
{
	const unsigned numrows = height;
	const unsigned numcols = width;
	const unsigned rowparity = ystart & 1;
	const unsigned colparity = xstart & 1;

	jpc_fix_t *startptr;

	startptr = &a[0];
	for (unsigned i = 0; i < numrows; ++i) {
		jpc_ft_invlift_row(startptr, numcols, colparity);
		jpc_qmfb_join_row(startptr, numcols, colparity);
		startptr += stride;
	}

	const unsigned maxcols = (numcols / JPC_QMFB_COLGRPSIZE) * JPC_QMFB_COLGRPSIZE;
	startptr = &a[0];
	for (unsigned i = 0; i < maxcols; i += JPC_QMFB_COLGRPSIZE) {
		jpc_ft_invlift_colgrp(startptr, numrows, stride, rowparity);
		jpc_qmfb_join_colgrp(startptr, numrows, stride, rowparity);
		startptr += JPC_QMFB_COLGRPSIZE;
	}
	if (maxcols < numcols) {
		jpc_ft_invlift_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
		jpc_qmfb_join_colres(startptr, numrows, numcols - maxcols, stride,
		  rowparity);
	}

	return 0;

}